

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O3

int xmlC14NProcessAttrsAxis(xmlC14NCtxPtr ctx,xmlNodePtr cur,int parent_visible)

{
  xmlC14NMode xVar1;
  xmlNodePtr pxVar2;
  int iVar3;
  uint uVar4;
  xmlListPtr l;
  void *pvVar5;
  xmlNodePtr data;
  xmlChar *URI;
  xmlAttrPtr pxVar6;
  xmlChar *str;
  xmlChar *in_RCX;
  xmlChar *base;
  _xmlNode *p_Var7;
  char *msg;
  char *pcVar8;
  xmlNodePtr pxVar9;
  _xmlAttr *data_00;
  bool bVar10;
  xmlNodePtr local_48;
  xmlNodePtr local_40;
  xmlChar *local_38;
  
  if (cur->type != XML_ELEMENT_NODE) {
    xmlC14NErrFull(ctx,(xmlNodePtr)0x0,0x73,(char *)0x0,"Invalid argument\n",0);
    return -1;
  }
  l = xmlListCreate((xmlListDeallocator)0x0,xmlC14NAttrsCompare);
  if (l == (xmlListPtr)0x0) {
    if (ctx != (xmlC14NCtxPtr)0x0) {
      ctx->error = 2;
    }
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x15,
                        (xmlError *)0x0);
    return -1;
  }
  xVar1 = ctx->mode;
  if (xVar1 == XML_C14N_1_1) {
    pxVar9 = (xmlNodePtr)cur->properties;
    if (pxVar9 == (xmlNodePtr)0x0) {
      data = (xmlNodePtr)0x0;
      local_48 = (xmlNodePtr)0x0;
      if (parent_visible == 0) goto LAB_0015f776;
LAB_0015f4f9:
      local_40 = (xmlNodePtr)xmlC14NFindHiddenParentAttr(ctx,cur->parent,"lang",in_RCX);
      if (local_40 != (xmlNodePtr)0x0) {
LAB_0015f515:
        xmlListInsert(l,local_40);
      }
      if ((data != (xmlNodePtr)0x0) ||
         (data = (xmlNodePtr)xmlC14NFindHiddenParentAttr(ctx,cur->parent,"space",in_RCX),
         data != (xmlNodePtr)0x0)) {
        xmlListInsert(l,data);
      }
      if ((local_48 != (xmlNodePtr)0x0) ||
         (local_48 = (xmlNodePtr)xmlC14NFindHiddenParentAttr(ctx,cur->parent,"base",in_RCX),
         local_48 != (xmlNodePtr)0x0)) {
        if (local_48->parent == (_xmlNode *)0x0) {
          msg = "Invalid argument\n";
          p_Var7 = (xmlNodePtr)0x0;
          iVar3 = 0x73;
          pcVar8 = (char *)0x0;
LAB_0015f6fe:
          xmlC14NErrFull(ctx,p_Var7,iVar3,(char *)0x0,msg,pcVar8);
        }
        else {
          URI = xmlNodeListGetString(ctx->doc,local_48->children,1);
          if (URI == (xmlChar *)0x0) {
LAB_0015f75a:
            ctx->error = 2;
            xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                                0x15,(xmlError *)0x0);
          }
          else {
            p_Var7 = local_48->parent->parent;
            if (p_Var7 == (_xmlNode *)0x0) {
LAB_0015f690:
              iVar3 = xmlStrEqual(URI,"");
              if (iVar3 == 0) {
                local_48 = (xmlNodePtr)xmlNewNsProp((xmlNodePtr)0x0,local_48->ns,"base",URI);
                (*xmlFree)(URI);
                if (local_48 != (xmlNodePtr)0x0) {
                  xmlListInsert(l,local_48);
                  local_48->next = (_xmlNode *)0x0;
                  goto LAB_0015f776;
                }
                goto LAB_0015f75a;
              }
            }
            else {
              do {
                if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                   (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,p_Var7,p_Var7->parent),
                   iVar3 != 0)) break;
                pxVar6 = xmlHasNsProp(p_Var7,"base",
                                      (xmlChar *)"http://www.w3.org/XML/1998/namespace");
                if (pxVar6 != (xmlAttrPtr)0x0) {
                  str = xmlNodeListGetString(ctx->doc,pxVar6->children,1);
                  if (str == (xmlChar *)0x0) {
                    (*xmlFree)(URI);
                    goto LAB_0015f75a;
                  }
                  uVar4 = xmlStrlen(str);
                  base = str;
                  if (((1 < (int)uVar4) && (str[(ulong)uVar4 - 2] == '.')) &&
                     (local_38 = xmlStrcat(str,"/"), base = local_38, local_38 == (xmlChar *)0x0)) {
                    (*xmlFree)(str);
                    (*xmlFree)(URI);
                    goto LAB_0015f75a;
                  }
                  iVar3 = xmlBuildURISafe(URI,base,&local_38);
                  (*xmlFree)(base);
                  (*xmlFree)(URI);
                  URI = local_38;
                  if (iVar3 != 0) {
                    if (iVar3 < 0) goto LAB_0015f75a;
                    msg = "%s";
                    pcVar8 = "processing xml:base attribute - can\'t construct uri";
                    iVar3 = 0x5b;
                    goto LAB_0015f6fe;
                  }
                }
                p_Var7 = p_Var7->parent;
              } while (p_Var7 != (_xmlNode *)0x0);
              if (URI != (xmlChar *)0x0) goto LAB_0015f690;
              URI = (xmlChar *)0x0;
            }
            (*xmlFree)(URI);
          }
        }
      }
    }
    else {
      data = (xmlNodePtr)0x0;
      local_40 = (xmlNodePtr)0x0;
      local_48 = (xmlNodePtr)0x0;
      do {
        if (((parent_visible == 0) || (pxVar9->ns == (xmlNsPtr)0x0)) ||
           (iVar3 = xmlC14NIsXmlNs(pxVar9->ns), iVar3 == 0)) {
LAB_0015f405:
          if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
             (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,cur), pxVar2 = local_40,
             iVar3 != 0)) {
            xmlListInsert(l,pxVar9);
            pxVar2 = local_40;
          }
        }
        else if ((local_40 != (xmlNodePtr)0x0) ||
                (iVar3 = xmlStrEqual(pxVar9->name,"lang"), pxVar2 = pxVar9, iVar3 == 0)) {
          if (data == (xmlNodePtr)0x0) {
            iVar3 = xmlStrEqual(pxVar9->name,"space");
            bVar10 = iVar3 == 0;
            data = (xmlNodePtr)0x0;
            if (!bVar10) {
              data = pxVar9;
            }
            in_RCX = (xmlChar *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar10);
            if (!bVar10 || local_48 != (xmlNodePtr)0x0) {
              pxVar2 = local_40;
              if (iVar3 == 0) goto LAB_0015f405;
              goto LAB_0015f429;
            }
          }
          else if (local_48 != (xmlNodePtr)0x0) goto LAB_0015f405;
          iVar3 = xmlStrEqual(pxVar9->name,"base");
          local_48 = pxVar9;
          pxVar2 = local_40;
          if (iVar3 == 0) {
            local_48 = (xmlNodePtr)0x0;
            goto LAB_0015f405;
          }
        }
LAB_0015f429:
        local_40 = pxVar2;
        pxVar9 = pxVar9->next;
      } while (pxVar9 != (_xmlNode *)0x0);
      if (parent_visible != 0) {
        if (local_40 == (xmlNodePtr)0x0) goto LAB_0015f4f9;
        goto LAB_0015f515;
      }
    }
  }
  else if (xVar1 == XML_C14N_EXCLUSIVE_1_0) {
    pxVar9 = (xmlNodePtr)cur->properties;
    if (pxVar9 != (xmlNodePtr)0x0) {
      local_48 = (xmlNodePtr)0x0;
      do {
        if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
           (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,cur), iVar3 != 0)) {
          xmlListInsert(l,pxVar9);
        }
        pxVar9 = pxVar9->next;
      } while (pxVar9 != (_xmlNode *)0x0);
      goto LAB_0015f776;
    }
  }
  else if (xVar1 == XML_C14N_1_0) {
    for (pxVar9 = (xmlNodePtr)cur->properties; pxVar9 != (xmlNodePtr)0x0; pxVar9 = pxVar9->next) {
      if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
         (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,cur), iVar3 != 0)) {
        xmlListInsert(l,pxVar9);
      }
    }
    if (((parent_visible != 0) && (pxVar9 = cur->parent, pxVar9 != (xmlNodePtr)0x0)) &&
       ((ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0 &&
        ((iVar3 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,pxVar9->parent), iVar3 == 0 &&
         (p_Var7 = cur->parent, p_Var7 != (_xmlNode *)0x0)))))) {
      local_48 = (xmlNodePtr)0x0;
      do {
        for (data_00 = p_Var7->properties; data_00 != (_xmlAttr *)0x0; data_00 = data_00->next) {
          if (((data_00->ns != (xmlNsPtr)0x0) && (iVar3 = xmlC14NIsXmlNs(data_00->ns), iVar3 != 0))
             && (pvVar5 = xmlListSearch(l,data_00), pvVar5 == (void *)0x0)) {
            xmlListInsert(l,data_00);
          }
        }
        p_Var7 = p_Var7->parent;
      } while (p_Var7 != (_xmlNode *)0x0);
      goto LAB_0015f776;
    }
  }
  local_48 = (xmlNodePtr)0x0;
LAB_0015f776:
  xmlListWalk(l,xmlC14NPrintAttrs,ctx);
  xmlFreePropList((xmlAttrPtr)local_48);
  xmlListDelete(l);
  return 0;
}

Assistant:

static int
xmlC14NProcessAttrsAxis(xmlC14NCtxPtr ctx, xmlNodePtr cur, int parent_visible)
{
    xmlAttrPtr attr;
    xmlListPtr list;
    xmlAttrPtr attrs_to_delete = NULL;

    /* special processing for 1.1 spec */
    xmlAttrPtr xml_base_attr = NULL;
    xmlAttrPtr xml_lang_attr = NULL;
    xmlAttrPtr xml_space_attr = NULL;

    if ((ctx == NULL) || (cur == NULL) || (cur->type != XML_ELEMENT_NODE)) {
        xmlC14NErrParam(ctx);
        return (-1);
    }

    /*
     * Create a sorted list to store element attributes
     */
    list = xmlListCreate(NULL, xmlC14NAttrsCompare);
    if (list == NULL) {
        xmlC14NErrMemory(ctx);
        return (-1);
    }

    switch(ctx->mode) {
    case XML_C14N_1_0:
        /* The processing of an element node E MUST be modified slightly when an XPath node-set is
         * given as input and the element's parent is omitted from the node-set. The method for processing
         * the attribute axis of an element E in the node-set is enhanced. All element nodes along E's
         * ancestor axis are examined for nearest occurrences of attributes in the xml namespace, such
         * as xml:lang and xml:space (whether or not they are in the node-set). From this list of attributes,
         * remove any that are in E's attribute axis (whether or not they are in the node-set). Then,
         * lexicographically merge this attribute list with the nodes of E's attribute axis that are in
         * the node-set. The result of visiting the attribute axis is computed by processing the attribute
         * nodes in this merged attribute list.
         */

        /*
         * Add all visible attributes from current node.
         */
        attr = cur->properties;
        while (attr != NULL) {
            /* check that attribute is visible */
            if (xmlC14NIsVisible(ctx, attr, cur)) {
                xmlListInsert(list, attr);
            }
            attr = attr->next;
        }

        /*
         * Handle xml attributes
         */
        if (parent_visible && (cur->parent != NULL) &&
            (!xmlC14NIsVisible(ctx, cur->parent, cur->parent->parent)))
        {
            xmlNodePtr tmp;

            /*
             * If XPath node-set is not specified then the parent is always
             * visible!
             */
            tmp = cur->parent;
            while (tmp != NULL) {
                attr = tmp->properties;
                while (attr != NULL) {
                    if (xmlC14NIsXmlAttr(attr) != 0) {
                        if (xmlListSearch(list, attr) == NULL) {
                            xmlListInsert(list, attr);
                        }
                    }
                    attr = attr->next;
                }
                tmp = tmp->parent;
            }
        }

        /* done */
        break;
    case XML_C14N_EXCLUSIVE_1_0:
        /* attributes in the XML namespace, such as xml:lang and xml:space
         * are not imported into orphan nodes of the document subset
         */

        /*
         * Add all visible attributes from current node.
         */
        attr = cur->properties;
        while (attr != NULL) {
            /* check that attribute is visible */
            if (xmlC14NIsVisible(ctx, attr, cur)) {
                xmlListInsert(list, attr);
            }
            attr = attr->next;
        }

        /* do nothing special for xml attributes */
        break;
    case XML_C14N_1_1:
        /* The processing of an element node E MUST be modified slightly when an XPath node-set is
         * given as input and some of the element's ancestors are omitted from the node-set.
         *
         * Simple inheritable attributes are attributes that have a value that requires at most a simple
         * redeclaration. This redeclaration is done by supplying a new value in the child axis. The
         * redeclaration of a simple inheritable attribute A contained in one of E's ancestors is done
         * by supplying a value to an attribute Ae inside E with the same name. Simple inheritable attributes
         * are xml:lang and xml:space.
         *
         * The method for processing the attribute axis of an element E in the node-set is hence enhanced.
         * All element nodes along E's ancestor axis are examined for the nearest occurrences of simple
         * inheritable attributes in the xml namespace, such as xml:lang and xml:space (whether or not they
         * are in the node-set). From this list of attributes, any simple inheritable attributes that are
         * already in E's attribute axis (whether or not they are in the node-set) are removed. Then,
         * lexicographically merge this attribute list with the nodes of E's attribute axis that are in
         * the node-set. The result of visiting the attribute axis is computed by processing the attribute
         * nodes in this merged attribute list.
         *
         * The xml:id attribute is not a simple inheritable attribute and no processing of these attributes is
         * performed.
         *
         * The xml:base attribute is not a simple inheritable attribute and requires special processing beyond
         * a simple redeclaration.
         *
         * Attributes in the XML namespace other than xml:base, xml:id, xml:lang, and xml:space MUST be processed
         * as ordinary attributes.
         */

        /*
         * Add all visible attributes from current node.
         */
        attr = cur->properties;
        while (attr != NULL) {
            /* special processing for XML attribute kiks in only when we have invisible parents */
            if ((!parent_visible) || (xmlC14NIsXmlAttr(attr) == 0)) {
                /* check that attribute is visible */
                if (xmlC14NIsVisible(ctx, attr, cur)) {
                    xmlListInsert(list, attr);
                }
            } else {
                int matched = 0;

                /* check for simple inheritance attributes */
                if((!matched) && (xml_lang_attr == NULL) && xmlStrEqual(attr->name, BAD_CAST "lang")) {
                    xml_lang_attr = attr;
                    matched = 1;
                }
                if((!matched) && (xml_space_attr == NULL) && xmlStrEqual(attr->name, BAD_CAST "space")) {
                    xml_space_attr = attr;
                    matched = 1;
                }

                /* check for base attr */
                if((!matched) && (xml_base_attr == NULL) && xmlStrEqual(attr->name, BAD_CAST "base")) {
                    xml_base_attr = attr;
                    matched = 1;
                }

                /* otherwise, it is a normal attribute, so just check if it is visible */
                if((!matched) && xmlC14NIsVisible(ctx, attr, cur)) {
                    xmlListInsert(list, attr);
                }
            }

            /* move to the next one */
            attr = attr->next;
        }

        /* special processing for XML attribute kiks in only when we have invisible parents */
        if ((parent_visible)) {

            /* simple inheritance attributes - copy */
            if(xml_lang_attr == NULL) {
                xml_lang_attr = xmlC14NFindHiddenParentAttr(ctx, cur->parent, BAD_CAST "lang", XML_XML_NAMESPACE);
            }
            if(xml_lang_attr != NULL) {
                xmlListInsert(list, xml_lang_attr);
            }
            if(xml_space_attr == NULL) {
                xml_space_attr = xmlC14NFindHiddenParentAttr(ctx, cur->parent, BAD_CAST "space", XML_XML_NAMESPACE);
            }
            if(xml_space_attr != NULL) {
                xmlListInsert(list, xml_space_attr);
            }

            /* base uri attribute - fix up */
            if(xml_base_attr == NULL) {
                /* if we don't have base uri attribute, check if we have a "hidden" one above */
                xml_base_attr = xmlC14NFindHiddenParentAttr(ctx, cur->parent, BAD_CAST "base", XML_XML_NAMESPACE);
            }
            if(xml_base_attr != NULL) {
                xml_base_attr = xmlC14NFixupBaseAttr(ctx, xml_base_attr);
                if(xml_base_attr != NULL) {
                    xmlListInsert(list, xml_base_attr);

                    /* note that we MUST delete returned attr node ourselves! */
                    xml_base_attr->next = attrs_to_delete;
                    attrs_to_delete = xml_base_attr;
                }
            }
        }

        /* done */
        break;
    }

    /*
     * print out all elements from list
     */
    xmlListWalk(list, xmlC14NPrintAttrs, (void *) ctx);

    /*
     * Cleanup
     */
    xmlFreePropList(attrs_to_delete);
    xmlListDelete(list);
    return (0);
}